

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *
tinyusdz::lerp<tinyusdz::value::point3h>
          (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *a,
          vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *b,double t)

{
  pointer ppVar1;
  point3h pVar2;
  ulong uVar3;
  long lVar4;
  ulong __new_size;
  point3h local_48;
  point3h local_40 [2];
  float local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = ((long)(a->
                 super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 1) * -0x5555555555555555;
  __new_size = ((long)(b->
                      super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 1) * -0x5555555555555555;
  if (uVar3 <= __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      local_34 = (float)(1.0 - t);
      lVar4 = 0;
      do {
        ppVar1 = (b->
                 super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pVar2 = operator*(local_34,(point3h *)
                                   ((long)&(((a->
                                             super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->x).value +
                                   lVar4));
        local_40[0]._0_4_ = pVar2._0_4_;
        local_40[0].z = pVar2.z.value;
        pVar2 = operator*((float)t,(point3h *)((long)&(ppVar1->x).value + lVar4));
        local_48._0_4_ = pVar2._0_4_;
        local_48.z = pVar2.z.value;
        pVar2 = operator+(local_40,&local_48);
        ppVar1 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(int *)((long)&(ppVar1->x).value + lVar4) = pVar2._0_4_;
        *(uint16_t *)((long)&(ppVar1->z).value + lVar4) = pVar2.z.value.value;
        lVar4 = lVar4 + 6;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}